

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_ThrustThingZ(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  AActor *pAVar1;
  undefined1 local_50 [8];
  FActorIterator iterator;
  double thrust;
  AActor *victim;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  iterator._8_8_ = (double)arg1 / 4.0;
  if (arg2 != 0) {
    iterator._8_8_ = -(double)iterator._8_8_;
  }
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      ln_local._4_4_ = 0;
    }
    else {
      if (arg3 == 0) {
        (it->Vel).Z = (double)iterator._8_8_;
      }
      else {
        (it->Vel).Z = (double)iterator._8_8_ + (it->Vel).Z;
      }
      ln_local._4_4_ = 1;
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)local_50,arg0);
    while (pAVar1 = FActorIterator::Next((FActorIterator *)local_50), pAVar1 != (AActor *)0x0) {
      if (arg3 == 0) {
        (pAVar1->Vel).Z = (double)iterator._8_8_;
      }
      else {
        (pAVar1->Vel).Z = (double)iterator._8_8_ + (pAVar1->Vel).Z;
      }
    }
    ln_local._4_4_ = 1;
  }
  return ln_local._4_4_;
}

Assistant:

FUNC(LS_ThrustThingZ)	// [BC]
// ThrustThingZ (tid, zthrust, down/up, set)
{
	AActor *victim;
	double thrust = arg1/4.;

	// [BC] Up is default
	if (arg2)
		thrust = -thrust;

	if (arg0 != 0)
	{
		FActorIterator iterator (arg0);

		while ( (victim = iterator.Next ()) )
		{
			if (!arg3)
				victim->Vel.Z = thrust;
			else
				victim->Vel.Z += thrust;
		}
		return true;
	}
	else if (it)
	{
		if (!arg3)
			it->Vel.Z = thrust;
		else
			it->Vel.Z += thrust;
		return true;
	}
	return false;
}